

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O0

UniquePtr<const_StyleSheetContainer> __thiscall
Rml::StyleSheetFactory::LoadStyleSheetContainer(StyleSheetFactory *this,String *sheet)

{
  bool bVar1;
  pointer pSVar2;
  pointer this_00;
  String *in_RDX;
  unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_> local_48 [3];
  unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_> local_30;
  UniquePtr<Rml::StreamFile> stream;
  UniquePtr<StyleSheetContainer> new_style_sheet;
  String *sheet_local;
  StyleSheetFactory *this_local;
  
  ::std::unique_ptr<Rml::StyleSheetContainer,std::default_delete<Rml::StyleSheetContainer>>::
  unique_ptr<std::default_delete<Rml::StyleSheetContainer>,void>
            ((unique_ptr<Rml::StyleSheetContainer,std::default_delete<Rml::StyleSheetContainer>> *)
             &stream);
  MakeUnique<Rml::StreamFile>();
  pSVar2 = ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::operator->
                     (&local_30);
  bVar1 = StreamFile::Open(pSVar2,in_RDX);
  if (bVar1) {
    MakeUnique<Rml::StyleSheetContainer>();
    ::std::unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_>::
    operator=((unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_>
               *)&stream,local_48);
    ::std::unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_>::
    ~unique_ptr(local_48);
    this_00 = ::std::
              unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_>::
              operator->((unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_>
                          *)&stream);
    pSVar2 = ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::get
                       (&local_30);
    bVar1 = StyleSheetContainer::LoadStyleSheetContainer(this_00,&pSVar2->super_Stream,1);
    if (!bVar1) {
      ::std::unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_>::
      reset((unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_> *)
            &stream,(pointer)0x0);
    }
  }
  ::std::
  unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>::
  unique_ptr<Rml::StyleSheetContainer,std::default_delete<Rml::StyleSheetContainer>,void>
            ((unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>
              *)this,(unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_>
                      *)&stream);
  ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::~unique_ptr(&local_30);
  ::std::unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_>::
  ~unique_ptr((unique_ptr<Rml::StyleSheetContainer,_std::default_delete<Rml::StyleSheetContainer>_>
               *)&stream);
  return (__uniq_ptr_data<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>,_true,_true>
          )(__uniq_ptr_data<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>,_true,_true>
            )this;
}

Assistant:

UniquePtr<const StyleSheetContainer> StyleSheetFactory::LoadStyleSheetContainer(const String& sheet)
{
	UniquePtr<StyleSheetContainer> new_style_sheet;

	// Open stream, construct new sheet and pass the stream into the sheet
	auto stream = MakeUnique<StreamFile>();
	if (stream->Open(sheet))
	{
		new_style_sheet = MakeUnique<StyleSheetContainer>();
		if (!new_style_sheet->LoadStyleSheetContainer(stream.get()))
		{
			new_style_sheet.reset();
		}
	}

	return new_style_sheet;
}